

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mdspan.h
# Opt level: O2

void __thiscall
Gudhi::
Simple_mdspan<int,_Gudhi::extents<int,_2UL,_18446744073709551615UL,_2UL>,_Gudhi::layout_right>::
Simple_mdspan<int>(Simple_mdspan<int,_Gudhi::extents<int,_2UL,_18446744073709551615UL,_2UL>,_Gudhi::layout_right>
                   *this,data_handle_type ptr,int exts)

{
  undefined8 *puVar1;
  int iVar2;
  long lVar3;
  array<int,_3UL> aVar4;
  
  this->ptr_ = ptr;
  aVar4 = extents<int,_2UL,_18446744073709551615UL,_2UL>::_init_shifts();
  (this->map_).exts_.dynamic_extents_._M_elems[0] = exts;
  *&(this->map_).exts_.dynamic_extent_shifts_._M_elems = aVar4._M_elems;
  layout_right::mapping<Gudhi::extents<int,_2UL,_18446744073709551615UL,_2UL>_>::_initialize_strides
            (&this->map_);
  if (ptr == (data_handle_type)0x0) {
    lVar3 = (long)(this->map_).exts_.dynamic_extent_shifts_._M_elems[0];
    if (lVar3 < 0) {
      iVar2 = 2;
    }
    else {
      iVar2 = (&(this->map_).exts_.dynamic_extents_)[lVar3]._M_elems[0];
    }
    if (iVar2 * (this->map_).ext_shifts_._M_elems[0] != 0) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = "Given pointer is not properly initialized.";
      __cxa_throw(puVar1,&char_const*::typeinfo,0);
    }
  }
  return;
}

Assistant:

explicit Simple_mdspan(data_handle_type ptr, IndexTypes... exts)
      : ptr_(ptr), map_(extents_type(exts...))
  {
    GUDHI_CHECK(ptr != nullptr || empty() || Extents::rank() == 0, "Given pointer is not properly initialized.");
  }